

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O2

string * __thiscall BigInt::to_string_abi_cxx11_(string *__return_storage_ptr__,BigInt *this)

{
  ostream *poVar1;
  int iVar2;
  stringstream ss;
  long local_1a0 [2];
  long alStack_190 [45];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  if (this->sign == -1) {
    std::operator<<((ostream *)local_1a0,'-');
  }
  std::ostream::_M_insert<long_long>((longlong)local_1a0);
  for (iVar2 = (int)((ulong)((long)(this->vector_value).
                                   super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                                   .super__Vector_impl_data._M_finish -
                            (long)(this->vector_value).
                                  super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3) + -2; -1 < iVar2;
      iVar2 = iVar2 + -1) {
    *(long *)((long)alStack_190 + *(long *)(local_1a0[0] + -0x18)) = (long)base_digits;
    poVar1 = std::operator<<(local_1a0,0x30);
    std::ostream::_M_insert<long_long>((longlong)poVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string to_string() {
        stringstream ss;
        //!send sign
        if (sign == NEGATIVE)
            ss << '-';

        //!get the last element
        ss << (vector_value.empty() ? 0 : vector_value.back());

        //!continue from the back
        for (int i = (int) vector_value.size() - 2; i >= 0; --i)
            ss << setw(base_digits)/*!width*/ << setfill('0')/*!empty placeholder*/ << vector_value[i]/*!number*/;

        return ss.str();
    }